

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_74(QPDF *pdf,char *arg2)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  string *k;
  string *k_00;
  string *k_01;
  undefined1 in_R8B;
  QPDFObjectHandle QVar4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  QPDFWriter w;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8 [8];
  iterator __end1;
  anon_class_8_1_6bbe3995 check_split1;
  string local_128 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  string local_118 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  string local_108 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  QPDFNameTreeObjectHelper split3;
  QPDFNameTreeObjectHelper split2;
  QPDFNumberTreeObjectHelper split1;
  allocator<char> local_50 [32];
  
  poVar2 = std::operator<<((ostream *)&std::cout,"/Split1");
  std::endl<char,std::char_traits<char>>(poVar2);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/Split1",(allocator<char> *)&split2);
  QPDFObjectHandle::getKey(local_108);
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_108;
  QPDFNumberTreeObjectHelper::QPDFNumberTreeObjectHelper(&split1,QVar4,(QPDF *)0x1,(bool)in_R8B);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end1.impl);
  QPDFNumberTreeObjectHelper::setSplitThreshold((int)&split1);
  check_split1.split1 = &split1;
  test_74::anon_class_8_1_6bbe3995::operator()(&check_split1,0xf);
  test_74::anon_class_8_1_6bbe3995::operator()(&check_split1,0x23);
  test_74::anon_class_8_1_6bbe3995::operator()(&check_split1,0x7d);
  QPDFNumberTreeObjectHelper::begin();
  QPDFNumberTreeObjectHelper::end();
  while( true ) {
    bVar1 = QPDFNumberTreeObjectHelper::iterator::operator!=((iterator *)&w,&__end1);
    if (!bVar1) break;
    QPDFNumberTreeObjectHelper::iterator::operator*((iterator *)&w);
    poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar2);
    QPDFNumberTreeObjectHelper::iterator::operator++((iterator *)&w);
  }
  QPDFNumberTreeObjectHelper::iterator::~iterator(&__end1);
  QPDFNumberTreeObjectHelper::iterator::~iterator((iterator *)&w);
  poVar2 = std::operator<<((ostream *)&std::cout,"/Split2");
  std::endl<char,std::char_traits<char>>(poVar2);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,"/Split2",(allocator<char> *)&split3);
  QPDFObjectHandle::getKey(local_118);
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_118;
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&split2,QVar5,(QPDF *)0x1,(bool)in_R8B);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_110);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end1.impl);
  QPDFNameTreeObjectHelper::setSplitThreshold((int)&split2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"C",(allocator<char> *)&__end1);
  test_74::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&split2,(QPDFNameTreeObjectHelper *)&w,k);
  std::__cxx11::string::~string((string *)&w);
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while( true ) {
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=((iterator *)&w,(iterator *)&__end1);
    if (!bVar1) break;
    psVar3 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar2 = std::operator<<((ostream *)&std::cout,psVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    QPDFNameTreeObjectHelper::iterator::operator++((iterator *)&w);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&__end1);
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&w);
  poVar2 = std::operator<<((ostream *)&std::cout,"/Split3");
  std::endl<char,std::char_traits<char>>(poVar2);
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"/Split3",local_50);
  QPDFObjectHandle::getKey(local_128);
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_128;
  QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&split3,QVar6,(QPDF *)0x1,(bool)in_R8B);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120);
  std::__cxx11::string::~string((string *)&w);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__end1.impl);
  QPDFNameTreeObjectHelper::setSplitThreshold((int)&split3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&w,"P",(allocator<char> *)&__end1);
  test_74::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&split3,(QPDFNameTreeObjectHelper *)&w,k_00);
  std::__cxx11::string::~string((string *)&w);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&w,anon_var_dwarf_1a213,(allocator<char> *)&__end1);
  test_74::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&split3,(QPDFNameTreeObjectHelper *)&w,k_01);
  std::__cxx11::string::~string((string *)&w);
  QPDFNameTreeObjectHelper::begin();
  QPDFNameTreeObjectHelper::end();
  while( true ) {
    bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=((iterator *)&w,(iterator *)&__end1);
    if (!bVar1) break;
    psVar3 = (string *)QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_();
    poVar2 = std::operator<<((ostream *)&std::cout,psVar3);
    poVar2 = std::operator<<(poVar2," ");
    QPDFObjectHandle::unparse_abi_cxx11_();
    poVar2 = std::operator<<(poVar2,(string *)local_50);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)local_50);
    QPDFNameTreeObjectHelper::iterator::operator++((iterator *)&w);
  }
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&__end1);
  QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&w);
  QPDFWriter::QPDFWriter(&w,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(&w,0));
  QPDFWriter::setQDFMode(SUB81(&w,0));
  QPDFWriter::write();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1b8);
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&split3);
  QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&split2);
  QPDFNumberTreeObjectHelper::~QPDFNumberTreeObjectHelper(&split1);
  return;
}

Assistant:

static void
test_74(QPDF& pdf, char const* arg2)
{
    // This test is crafted to work with split-nntree.pdf
    std::cout << "/Split1" << std::endl;
    auto split1 = QPDFNumberTreeObjectHelper(pdf.getTrailer().getKey("/Split1"), pdf);
    split1.setSplitThreshold(4);
    auto check_split1 = [&split1](int k) {
        auto i = split1.insert(k, QPDFObjectHandle::newString(QUtil::int_to_string(k)));
        assert(i->first == k);
    };
    check_split1(15);
    check_split1(35);
    check_split1(125);
    for (auto const& i: split1) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Split2" << std::endl;
    auto split2 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Split2"), pdf);
    split2.setSplitThreshold(4);
    auto check_split2 = [](QPDFNameTreeObjectHelper& noh, std::string const& k) {
        auto i = noh.insert(k, QPDFObjectHandle::newUnicodeString(k));
        assert(i->first == k);
    };
    check_split2(split2, "C");
    for (auto const& i: split2) {
        std::cout << i.first << std::endl;
    }

    std::cout << "/Split3" << std::endl;
    auto split3 = QPDFNameTreeObjectHelper(pdf.getTrailer().getKey("/Split3"), pdf);
    split3.setSplitThreshold(4);
    check_split2(split3, "P");
    check_split2(split3, "\xcf\x80");
    for (auto& i: split3) {
        std::cout << i.first << " " << i.second.unparse() << std::endl;
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setQDFMode(true);
    w.write();
}